

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

bool __thiscall CProfileNode::Return(CProfileNode *this)

{
  int iVar1;
  timeval currentTime;
  timeval local_20;
  
  iVar1 = this->RecursionCounter + -1;
  this->RecursionCounter = iVar1;
  if ((iVar1 == 0) && (this->TotalCalls != 0)) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    this->TotalTime =
         (float)(((local_20.tv_sec - ((gProfileClock.m_data)->mStartTime).tv_sec) * 1000000 +
                 local_20.tv_usec) -
                (((gProfileClock.m_data)->mStartTime).tv_usec + this->StartTime)) / 1000.0 +
         this->TotalTime;
    iVar1 = this->RecursionCounter;
  }
  return iVar1 == 0;
}

Assistant:

bool	CProfileNode::Return( void )
{
	if ( --RecursionCounter == 0 && TotalCalls != 0 ) {
		unsigned long int time;
		Profile_Get_Ticks(&time);
		time-=StartTime;
		TotalTime += (float)time / Profile_Get_Tick_Rate();
	}
	return ( RecursionCounter == 0 );
}